

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O2

void ma_wrench_tf_tgt_to_ref(ga_pose *x,ma_wrench *f,ma_wrench *r)

{
  frame *pfVar1;
  uint __line;
  char *__assertion;
  
  if (x == (ga_pose *)0x0) {
    __assertion = "x";
    __line = 0x6a;
  }
  else if (f == (ma_wrench *)0x0) {
    __assertion = "f";
    __line = 0x6b;
  }
  else if (r == (ma_wrench *)0x0) {
    __assertion = "r";
    __line = 0x6c;
  }
  else if (f == r) {
    __assertion = "f != r";
    __line = 0x6d;
  }
  else if (f->point == f->frame->origin) {
    if (f->frame == x->target_frame) {
      r->body = f->body;
      pfVar1 = x->reference_frame;
      r->frame = pfVar1;
      r->point = pfVar1->origin;
      return;
    }
    __assertion = "f->frame == x->target_frame";
    __line = 0x6f;
  }
  else {
    __assertion = "f->point == f->frame->origin";
    __line = 0x6e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,__line,
                "void ma_wrench_tf_tgt_to_ref(const struct ga_pose *, const struct ma_wrench *, struct ma_wrench *)"
               );
}

Assistant:

void ma_wrench_tf_tgt_to_ref(
        const struct ga_pose *x,
        const struct ma_wrench *f,
        struct ma_wrench *r)
{
    assert(x);
    assert(f);
    assert(r);
    assert(f != r);
    assert(f->point == f->frame->origin);
    assert(f->frame == x->target_frame);

    r->body = f->body;
    r->frame = x->reference_frame;
    r->point = r->frame->origin;
}